

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QList<int>_>::resize_internal(QList<QList<int>_> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QGenericArrayOps<QList<int>_> *this_00;
  __off_t __length;
  QArrayDataPointer<QList<int>_> *in_RSI;
  QArrayDataPointer<QList<int>_> *in_RDI;
  QArrayDataPointer<QList<int>_> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QList<int>_> *this_01;
  QArrayDataPointer<QList<int>_> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QList<int>_> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QList<int>_> *__file;
  
  QArrayDataPointer<QList<int>_>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QList<int>_>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QList<int>_> *)capacity((QList<QList<int>_> *)0x5cacb1);
    qVar2 = QArrayDataPointer<QList<int>_>::freeSpaceAtBegin(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QList<int>_> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QGenericArrayOps<QList<int>_> *)QArrayDataPointer<QList<int>_>::operator->(in_RDI);
      QtPrivate::QGenericArrayOps<QList<int>_>::truncate(this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QList<int>_>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (QList<int> **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}